

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
SerializePointer<FPolyObj>
          (FSerializer *arc,char *key,FPolyObj **value,FPolyObj **defval,FPolyObj *base)

{
  uint uVar1;
  FPolyObj *pFVar2;
  int64_t vv;
  
  if (base == (FPolyObj *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = FPolyObj]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (((uVar1 != 0) && (defval != (FPolyObj **)0x0)) &&
       ((arc->w->mInObject).Array[uVar1 - 1] != false)) {
      pFVar2 = *value;
      if (pFVar2 == *defval) {
        return arc;
      }
      goto LAB_00474ac9;
    }
  }
  pFVar2 = *value;
LAB_00474ac9:
  if (pFVar2 == (FPolyObj *)0x0) {
    vv = -1;
  }
  else {
    vv = ((long)pFVar2 - (long)base) / 0xf0;
  }
  Serialize(arc,key,&vv,(int64_t *)0x0);
  pFVar2 = base + vv;
  if (vv < 0) {
    pFVar2 = (FPolyObj *)0x0;
  }
  *value = pFVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}